

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,cmCustomCommandGenerator *ccg,cmGeneratorTarget *target,string *relative,
          bool echo_comment,ostream *content)

{
  bool bVar1;
  uint uVar2;
  TargetType targetType;
  char *pcVar3;
  string *psVar4;
  undefined4 extraout_var;
  cmOutputConverter *this_00;
  long lVar5;
  long lVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  ulong uVar8;
  ulong uVar9;
  uint c;
  char cVar10;
  undefined3 in_register_00000089;
  string output;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string launcher;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string cmd;
  string workingDir;
  string dir;
  string local_198;
  string currentBinDir;
  string shellCommand;
  
  if (CONCAT31(in_register_00000089,echo_comment) != 0) {
    pcVar3 = cmCustomCommandGenerator::GetComment(ccg);
    if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&shellCommand,pcVar3,(allocator<char> *)&dir);
      AppendEcho(this,commands,&shellCommand,EchoGenerate,(EchoProgress *)0x0);
      std::__cxx11::string::~string((string *)&shellCommand);
    }
  }
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&dir,(string *)psVar4);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&workingDir,ccg);
  if (workingDir._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&dir);
  }
  if (content != (ostream *)0x0) {
    std::operator<<(content,(string *)&dir);
  }
  rulePlaceholderExpander._M_t.
  super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
  .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._0_4_ =
       (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                 (this);
  rulePlaceholderExpander._M_t.
  super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
  .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._4_4_ = extraout_var;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&currentBinDir,(string *)psVar4);
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  c = 0;
  do {
    uVar2 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
    if (uVar2 <= c) {
      CreateCDCommand(this,&commands1,&dir,relative);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
                 (commands->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )commands1.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )commands1.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::string::~string((string *)&currentBinDir);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands1);
      std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
      ~unique_ptr(&rulePlaceholderExpander);
      std::__cxx11::string::~string((string *)&workingDir);
      std::__cxx11::string::~string((string *)&dir);
      return;
    }
    cmCustomCommandGenerator::GetCommand_abi_cxx11_(&cmd,ccg,c);
    if (cmd._M_string_length != 0) {
      bVar1 = cmLocalGenerator::IsWindowsShell((cmLocalGenerator *)this);
      if (bVar1) {
        shellCommand._M_dataplus._M_p = (pointer)&shellCommand.field_2;
        shellCommand._M_string_length = 0;
        shellCommand.field_2._M_local_buf[0] = '\0';
        if (cmd._M_string_length < 5) {
LAB_002cef6f:
          bVar1 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)&output,(ulong)&cmd);
          cmsys::SystemTools::LowerCase(&launcher,&output);
          std::__cxx11::string::operator=((string *)&shellCommand,(string *)&launcher);
          std::__cxx11::string::~string((string *)&launcher);
          std::__cxx11::string::~string((string *)&output);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&shellCommand,".bat");
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&shellCommand,".cmd");
            if (!bVar1) goto LAB_002cef6f;
          }
          bVar1 = true;
        }
        std::__cxx11::string::~string((string *)&shellCommand);
      }
      else {
        bVar1 = false;
      }
      cmsys::SystemTools::ReplaceString(&cmd,"/./","/");
      cVar10 = (char)&cmd;
      lVar5 = std::__cxx11::string::find(cVar10,0x2f);
      if (workingDir._M_string_length == 0) {
        cmLocalGenerator::MaybeConvertToRelativePath
                  (&shellCommand,(cmLocalGenerator *)this,&currentBinDir,&cmd);
        std::__cxx11::string::operator=((string *)&cmd,(string *)&shellCommand);
        std::__cxx11::string::~string((string *)&shellCommand);
      }
      lVar6 = std::__cxx11::string::find(cVar10,0x2f);
      if ((lVar5 != -1) && (lVar6 == -1)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &shellCommand,"./",&cmd);
        std::__cxx11::string::operator=((string *)&cmd,(string *)&shellCommand);
        std::__cxx11::string::~string((string *)&shellCommand);
      }
      launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
      launcher._M_string_length = 0;
      launcher.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&shellCommand,"RULE_LAUNCH_CUSTOM",(allocator<char> *)&output);
      pcVar3 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)this,target,&shellCommand);
      std::__cxx11::string::~string((string *)&shellCommand);
      if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
        cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)&shellCommand);
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        shellCommand._M_dataplus._M_p = (psVar4->_M_dataplus)._M_p;
        targetType = cmGeneratorTarget::GetType(target);
        shellCommand._M_string_length = (size_type)cmState::GetTargetTypeName(targetType);
        output._M_dataplus._M_p = (pointer)&output.field_2;
        output._M_string_length = 0;
        output.field_2._M_local_buf[0] = '\0';
        pvVar7 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
        if ((pvVar7->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (pvVar7->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::_M_assign((string *)&output);
          if (workingDir._M_string_length == 0) {
            psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                               ((cmLocalGenerator *)this);
            cmLocalGenerator::MaybeConvertToRelativePath
                      (&local_198,(cmLocalGenerator *)this,psVar4,&output);
            std::__cxx11::string::operator=((string *)&output,(string *)&local_198);
            std::__cxx11::string::~string((string *)&local_198);
          }
          cmOutputConverter::ConvertToOutputFormat(&local_198,this_00,&output,SHELL);
          std::__cxx11::string::operator=((string *)&output,(string *)&local_198);
          std::__cxx11::string::~string((string *)&local_198);
        }
        std::__cxx11::string::assign((char *)&launcher);
        cmRulePlaceholderExpander::ExpandRuleVariables
                  ((cmRulePlaceholderExpander *)
                   rulePlaceholderExpander._M_t.
                   super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                   .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,this_00,
                   &launcher,(RuleVariables *)&shellCommand);
        if (launcher._M_string_length != 0) {
          std::__cxx11::string::append((char *)&launcher);
        }
        std::__cxx11::string::~string((string *)&output);
      }
      MaybeConvertWatcomShellCommand(&shellCommand,this,&cmd);
      if (shellCommand._M_string_length == 0) {
        cmOutputConverter::ConvertToOutputFormat(&output,this_00,&cmd,SHELL);
        std::__cxx11::string::operator=((string *)&shellCommand,(string *)&output);
        std::__cxx11::string::~string((string *)&output);
      }
      std::operator+(&output,&launcher,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &shellCommand);
      std::__cxx11::string::operator=((string *)&cmd,(string *)&output);
      std::__cxx11::string::~string((string *)&output);
      cmCustomCommandGenerator::AppendArguments(ccg,c,&cmd);
      if (content != (ostream *)0x0) {
        std::operator<<(content,cmd._M_dataplus._M_p + launcher._M_string_length);
      }
      if (this->BorlandMakeCurlyHack == true) {
        uVar8 = std::__cxx11::string::find(cVar10,0x7b);
        if ((uVar8 != 0xffffffffffffffff) && (uVar8 < cmd._M_string_length - 1)) {
          uVar9 = std::__cxx11::string::find(cVar10,0x7d);
          if (uVar8 < uVar9) {
            std::__cxx11::string::substr((ulong)&output,(ulong)&cmd);
            std::__cxx11::string::append((char *)&output);
            std::__cxx11::string::substr((ulong)&local_198,(ulong)&cmd);
            std::__cxx11::string::append((string *)&output);
            std::__cxx11::string::~string((string *)&local_198);
            std::__cxx11::string::_M_assign((string *)&cmd);
            std::__cxx11::string::~string((string *)&output);
          }
        }
      }
      if (launcher._M_string_length == 0) {
        if (bVar1) {
          std::operator+(&output,"call ",&cmd);
        }
        else {
          bVar1 = cmLocalGenerator::IsNMake((cmLocalGenerator *)this);
          if ((!bVar1) || (*cmd._M_dataplus._M_p != '\"')) goto LAB_002cf382;
          std::operator+(&output,"echo >nul && ",&cmd);
        }
        std::__cxx11::string::operator=((string *)&cmd,(string *)&output);
        std::__cxx11::string::~string((string *)&output);
      }
LAB_002cf382:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands1,
                 &cmd);
      std::__cxx11::string::~string((string *)&shellCommand);
      std::__cxx11::string::~string((string *)&launcher);
    }
    std::__cxx11::string::~string((string *)&cmd);
    c = c + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomCommand(
  std::vector<std::string>& commands, cmCustomCommandGenerator const& ccg,
  cmGeneratorTarget* target, std::string const& relative, bool echo_comment,
  std::ostream* content)
{
  // Optionally create a command to display the custom command's
  // comment text.  This is used for pre-build, pre-link, and
  // post-build command comments.  Custom build step commands have
  // their comments generated elsewhere.
  if (echo_comment) {
    const char* comment = ccg.GetComment();
    if (comment && *comment) {
      this->AppendEcho(commands, comment,
                       cmLocalUnixMakefileGenerator3::EchoGenerate);
    }
  }

  // if the command specified a working directory use it.
  std::string dir = this->GetCurrentBinaryDirectory();
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }
  if (content) {
    *content << dir;
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  // Add each command line to the set of commands.
  std::vector<std::string> commands1;
  std::string currentBinDir = this->GetCurrentBinaryDirectory();
  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

      if (this->IsWindowsShell()) {
        std::string suffix;
        if (cmd.size() > 4) {
          suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
          if (suffix == ".bat" || suffix == ".cmd") {
            useCall = true;
          }
        }
      }

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd = this->MaybeConvertToRelativePath(currentBinDir, cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = "./" + cmd;
      }

      std::string launcher;
      // Short-circuit if there is no launcher.
      const char* val = this->GetRuleLauncher(target, "RULE_LAUNCH_CUSTOM");
      if (val && *val) {
        // Expand rule variables referenced in the given launcher command.
        cmRulePlaceholderExpander::RuleVariables vars;
        vars.CMTargetName = target->GetName().c_str();
        vars.CMTargetType = cmState::GetTargetTypeName(target->GetType());
        std::string output;
        const std::vector<std::string>& outputs = ccg.GetOutputs();
        if (!outputs.empty()) {
          output = outputs[0];
          if (workingDir.empty()) {
            output = this->MaybeConvertToRelativePath(
              this->GetCurrentBinaryDirectory(), output);
          }
          output =
            this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
        }
        vars.Output = output.c_str();

        launcher = val;
        rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
        if (!launcher.empty()) {
          launcher += " ";
        }
      }

      std::string shellCommand = this->MaybeConvertWatcomShellCommand(cmd);
      if (shellCommand.empty()) {
        shellCommand =
          this->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
      }
      cmd = launcher + shellCommand;

      ccg.AppendArguments(c, cmd);
      if (content) {
        // Rule content does not include the launcher.
        *content << (cmd.c_str() + launcher.size());
      }
      if (this->BorlandMakeCurlyHack) {
        // Borland Make has a very strange bug.  If the first curly
        // brace anywhere in the command string is a left curly, it
        // must be written {{} instead of just {.  Otherwise some
        // curly braces are removed.  The hack can be skipped if the
        // first curly brace is the last character.
        std::string::size_type lcurly = cmd.find('{');
        if (lcurly != std::string::npos && lcurly < (cmd.size() - 1)) {
          std::string::size_type rcurly = cmd.find('}');
          if (rcurly == std::string::npos || rcurly > lcurly) {
            // The first curly is a left curly.  Use the hack.
            std::string hack_cmd = cmd.substr(0, lcurly);
            hack_cmd += "{{}";
            hack_cmd += cmd.substr(lcurly + 1);
            cmd = hack_cmd;
          }
        }
      }
      if (launcher.empty()) {
        if (useCall) {
          cmd = "call " + cmd;
        } else if (this->IsNMake() && cmd[0] == '"') {
          cmd = "echo >nul && " + cmd;
        }
      }
      commands1.push_back(std::move(cmd));
    }
  }

  // Setup the proper working directory for the commands.
  this->CreateCDCommand(commands1, dir, relative);

  // push back the custom commands
  commands.insert(commands.end(), commands1.begin(), commands1.end());
}